

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

XmlRpcClient * __thiscall
miniros::RPCManager::getXMLRPCClient(RPCManager *this,string *host,int port,string *uri)

{
  __type_conflict _Var1;
  bool bVar2;
  SteadyTime SVar3;
  iterator __position;
  XmlRpcClient *this_00;
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> TVar4;
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> local_50;
  value_type local_48;
  
  std::mutex::lock(&this->clients_mutex_);
  __position._M_current =
       (this->clients_).
       super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
       ._M_impl.super__Vector_impl_data._M_start;
LAB_00240301:
  do {
    if (__position._M_current ==
        (this->clients_).
        super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (XmlRpcClient *)operator_new(0xf8);
      XmlRpc::XmlRpcClient::XmlRpcClient
                (this_00,(host->_M_dataplus)._M_p,port,(uri->_M_dataplus)._M_p);
      local_48.in_use_ = true;
      local_48.client_ = this_00;
      SVar3 = SteadyTime::now();
      local_48.last_use_time_.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.sec =
           SVar3.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.sec;
      local_48.last_use_time_.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.nsec =
           SVar3.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.nsec;
      std::vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>::
      push_back(&this->clients_,&local_48);
LAB_00240403:
      pthread_mutex_unlock((pthread_mutex_t *)&this->clients_mutex_);
      return this_00;
    }
    if ((__position._M_current)->in_use_ == false) {
      _Var1 = std::operator==(&(__position._M_current)->client_->_host,host);
      if ((_Var1) && ((__position._M_current)->client_->_port == port)) {
        _Var1 = std::operator==(&(__position._M_current)->client_->_uri,uri);
        if (_Var1) {
          this_00 = (__position._M_current)->client_;
          if ((this_00->_connectionState == IDLE) || (this_00->_connectionState == NO_CONNECTION)) {
            (__position._M_current)->in_use_ = true;
            TVar4 = (TimeBase<miniros::SteadyTime,_miniros::WallDuration>)SteadyTime::now();
            ((__position._M_current)->last_use_time_).
            super_TimeBase<miniros::SteadyTime,_miniros::WallDuration> = TVar4;
            goto LAB_00240403;
          }
        }
      }
      SVar3 = TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator+
                        (&((__position._M_current)->last_use_time_).
                          super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>,
                         (WallDuration *)&CachedXmlRpcClient::s_zombie_time_);
      local_48._0_4_ = SVar3.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.sec;
      local_48.last_use_time_.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.sec =
           SVar3.super_TimeBase<miniros::SteadyTime,_miniros::WallDuration>.nsec;
      local_50 = (TimeBase<miniros::SteadyTime,_miniros::WallDuration>)SteadyTime::now();
      bVar2 = TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator<
                        ((TimeBase<miniros::SteadyTime,_miniros::WallDuration> *)&local_48,
                         (SteadyTime *)&local_50);
      if (bVar2) {
        if ((__position._M_current)->client_ != (XmlRpcClient *)0x0) {
          (*((__position._M_current)->client_->super_XmlRpcSource)._vptr_XmlRpcSource[1])();
        }
        __position = std::
                     vector<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
                     ::erase(&this->clients_,__position._M_current);
        goto LAB_00240301;
      }
    }
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

XmlRpcClient* RPCManager::getXMLRPCClient(const std::string &host, const int port, const std::string &uri)
{
  // go through our vector of clients and grab the first available one
  XmlRpcClient *c = nullptr;

  std::scoped_lock<std::mutex> lock(clients_mutex_);

  for (auto i = clients_.begin(); !c && i != clients_.end(); )
  {
    if (!i->in_use_)
    {
      // see where it's pointing
      if (i->client_->getHost() == host &&
          i->client_->getPort() == port &&
          i->client_->getUri()  == uri)
      {
        // hooray, it's pointing at our destination. re-use it.
        if (i->client_->isReady()) {
          c = i->client_;
          i->in_use_ = true;
          i->last_use_time_ = SteadyTime::now();
          break;
        }
      }
      if (i->last_use_time_ + CachedXmlRpcClient::s_zombie_time_ < SteadyTime::now())
      {
        // toast this guy. he's dead and nobody is reusing him.
        delete i->client_;
        i = clients_.erase(i);
      }
      else
      {
        ++i; // move along. this guy isn't dead yet.
      }
    }
    else
    {
      ++i;
    }
  }

  if (!c)
  {
    // allocate a new one
    c = new XmlRpcClient(host.c_str(), port, uri.c_str());
    CachedXmlRpcClient mc(c);
    mc.in_use_ = true;
    mc.last_use_time_ = SteadyTime::now();
    clients_.push_back(mc);
    //ROS_INFO("%d xmlrpc clients allocated\n", xmlrpc_clients.size());
  }
  // ONUS IS ON THE RECEIVER TO UNSET THE IN_USE FLAG
  // by calling releaseXMLRPCClient
  return c;
}